

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::DuplicateNameDetector::check
          (DuplicateNameDetector *this,Reader nestedDecls,Which parentKind)

{
  ushort uVar1;
  Reader exp;
  Reader nestedDecls_00;
  Reader nestedDecls_01;
  ListElementCount LVar2;
  Which WVar3;
  char (*params) [25];
  char *pcVar4;
  ErrorReporter *pEVar5;
  char (*in_R8) [36];
  pair<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>,_bool>
  pVar6;
  Reader RVar7;
  StringPtr SVar8;
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  StringPtr message_02;
  StringPtr message_03;
  StringPtr message_04;
  StringPtr message_05;
  size_t sStackY_1e0;
  Reader nameText;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Reader decl;
  Fault f;
  uint local_104;
  Reader name;
  IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
  local_d0;
  Reader local_c0;
  Reader local_90;
  Reader local_60;
  
  LVar2 = nestedDecls.reader.elementCount;
  local_d0.container = &nestedDecls;
  local_d0.index = 0;
  do {
    if (local_d0.index == LVar2) {
      return;
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator*(&decl,&local_d0);
    Declaration::Reader::getName(&name,&decl);
    nameText = LocatedText::Reader::getValue(&name);
    _kjCondition.left = (unsigned_long)nameText.super_StringPtr.content.ptr;
    _kjCondition._8_8_ = nameText.super_StringPtr.content.size_;
    _kjCondition._32_8_ = name._reader.data;
    _kjCondition.op.content.ptr = (char *)name._reader.segment;
    _kjCondition.op.content.size_ = (size_t)name._reader.capTable;
    pVar6 = std::
            _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>>>
            ::_M_emplace_unique<std::pair<capnp::Text::Reader,capnp::compiler::LocatedText::Reader>>
                      ((_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>>>
                        *)&this->names,
                       (pair<capnp::Text::Reader,_capnp::compiler::LocatedText::Reader> *)
                       &_kjCondition);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (((nameText.super_StringPtr.content.size_ == 1) && (0x1f < decl._reader.dataSize)) &&
         (*(short *)((long)decl._reader.data + 2) == 7)) {
        pEVar5 = this->errorReporter;
        kj::str<char_const(&)[51]>
                  ((String *)&_kjCondition,
                   (kj *)"An unnamed union is already defined in this scope.",pVar6._8_8_);
        pcVar4 = "";
        if (_kjCondition._8_8_ != 0) {
          pcVar4 = (char *)_kjCondition.left;
        }
        message.content.size_ = _kjCondition._8_8_ + (ulong)(_kjCondition._8_8_ == 0);
        message.content.ptr = pcVar4;
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>(pEVar5,&name,message);
        kj::Array<char>::~Array((Array<char> *)&_kjCondition);
        pEVar5 = this->errorReporter;
        kj::str<char_const(&)[25]>((String *)&_kjCondition,(kj *)"Previously defined here.",params);
        pcVar4 = "";
        if (_kjCondition._8_8_ != 0) {
          pcVar4 = (char *)_kjCondition.left;
        }
        message_00.content.size_ = _kjCondition._8_8_ + (ulong)(_kjCondition._8_8_ == 0);
        message_00.content.ptr = pcVar4;
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                  (pEVar5,(Reader *)&pVar6.first._M_node._M_node[1]._M_left,message_00);
      }
      else {
        pEVar5 = this->errorReporter;
        kj::str<char_const(&)[2],capnp::Text::Reader&,char_const(&)[36]>
                  ((String *)&_kjCondition,(kj *)0x4c8c3f,(char (*) [2])&nameText,
                   (Reader *)"\' is already defined in this scope.",in_R8);
        pcVar4 = "";
        if (_kjCondition._8_8_ != 0) {
          pcVar4 = (char *)_kjCondition.left;
        }
        SVar8.content.size_ = _kjCondition._8_8_ + (ulong)(_kjCondition._8_8_ == 0);
        SVar8.content.ptr = pcVar4;
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>(pEVar5,&name,SVar8);
        kj::Array<char>::~Array((Array<char> *)&_kjCondition);
        pEVar5 = this->errorReporter;
        kj::str<char_const(&)[2],capnp::Text::Reader&,char_const(&)[27]>
                  ((String *)&_kjCondition,(kj *)0x4c8c3f,(char (*) [2])&nameText,
                   (Reader *)"\' previously defined here.",(char (*) [27])in_R8);
        pcVar4 = "";
        if (_kjCondition._8_8_ != 0) {
          pcVar4 = (char *)_kjCondition.left;
        }
        message_01.content.size_ = _kjCondition._8_8_ + (ulong)(_kjCondition._8_8_ == 0);
        message_01.content.ptr = pcVar4;
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                  (pEVar5,(Reader *)&pVar6.first._M_node._M_node[1]._M_left,message_01);
      }
      kj::Array<char>::~Array((Array<char> *)&_kjCondition);
    }
    if (decl._reader.dataSize < 0x20) {
LAB_00342d8c:
      _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
      _kjCondition.left = nameText.super_StringPtr.content.size_ - 1;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = _kjCondition.left == 0;
      if (_kjCondition.left != 0) {
        local_104 = 0;
        if (0x1f < decl._reader.dataSize) {
          local_104 = (uint)*(ushort *)((long)decl._reader.data + 2);
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[55],unsigned_int>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0x314,FAILED,"nameText.size() == 0",
                   "_kjCondition,\"Don\'t know what naming rules to enforce for node type.\", (uint)decl.which()"
                   ,&_kjCondition,
                   (char (*) [55])"Don\'t know what naming rules to enforce for node type.",
                   &local_104);
        kj::_::Debug::Fault::fatal(&f);
      }
    }
    else {
      uVar1 = *(ushort *)((long)decl._reader.data + 2);
      if (0xb < uVar1) goto LAB_00342d8c;
      if ((0xdd4U >> (uVar1 & 0x1f) & 1) == 0) {
        if ((0x228U >> (uVar1 & 0x1f) & 1) == 0) {
          if (uVar1 != 1) goto LAB_00342d8c;
          _kjCondition._36_2_ = decl._reader.pointerCount;
          _kjCondition._38_2_ = decl._reader._38_2_;
          _kjCondition._32_4_ = decl._reader.dataSize;
          _kjCondition.op.content.ptr = (char *)decl._reader.data;
          _kjCondition.op.content.size_ = (size_t)decl._reader.pointers;
          _kjCondition.left = (unsigned_long)decl._reader.segment;
          _kjCondition._8_8_ = decl._reader.capTable;
          Declaration::Using::Reader::getTarget(&local_60,(Reader *)&_kjCondition);
          exp._reader.capTable = local_60._reader.capTable;
          exp._reader.segment = local_60._reader.segment;
          exp._reader.data = local_60._reader.data;
          exp._reader.pointers = local_60._reader.pointers;
          exp._reader.dataSize = local_60._reader.dataSize;
          exp._reader.pointerCount = local_60._reader.pointerCount;
          exp._reader._38_2_ = local_60._reader._38_2_;
          exp._reader.nestingLimit = local_60._reader.nestingLimit;
          exp._reader._44_4_ = local_60._reader._44_4_;
          SVar8 = getExpressionTargetName(exp);
          if ((SVar8.content.size_ != 1) && ((byte)(*SVar8.content.ptr + 0x9fU) < 0x1a))
          goto LAB_00342dde;
        }
        if ((nameText.super_StringPtr.content.size_ != 1) &&
           ((byte)(*nameText.super_StringPtr.content.ptr + 0xa5U) < 0xe6)) {
          pEVar5 = this->errorReporter;
          pcVar4 = "Type names must begin with a capital letter.";
          sStackY_1e0 = 0x2d;
          goto LAB_00342e42;
        }
      }
      else {
LAB_00342dde:
        if ((nameText.super_StringPtr.content.size_ != 1) &&
           ((byte)(*nameText.super_StringPtr.content.ptr + 0x85U) < 0xe6)) {
          pEVar5 = this->errorReporter;
          pcVar4 = "Non-type names must begin with a lower-case letter.";
          sStackY_1e0 = 0x34;
LAB_00342e42:
          message_02.content.size_ = sStackY_1e0;
          message_02.content.ptr = pcVar4;
          ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>(pEVar5,&name,message_02);
        }
      }
    }
    kj::StringPtr::findFirst((StringPtr *)&_kjCondition,(char)&nameText);
    if ((char)_kjCondition.left == '\x01') {
      message_03.content.size_ = 0xab;
      message_03.content.ptr =
           "Cap\'n Proto declaration names should use camelCase and must not contain underscores. (Code generators may convert names to the appropriate style for the target language.)"
      ;
      ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                (this->errorReporter,&name,message_03);
    }
    if (decl._reader.dataSize < 0x20) {
switchD_00342ec4_default:
      pEVar5 = this->errorReporter;
      pcVar4 = "This kind of declaration doesn\'t belong here.";
      sStackY_1e0 = 0x2e;
LAB_00342e98:
      message_04.content.size_ = sStackY_1e0;
      message_04.content.ptr = pcVar4;
      ErrorReporter::addErrorOn<capnp::compiler::Declaration::Reader&>(pEVar5,&decl,message_04);
    }
    else {
      switch(*(undefined2 *)((long)decl._reader.data + 2)) {
      case 1:
      case 2:
      case 3:
      case 5:
      case 9:
      case 0xb:
        if ((INTERFACE < parentKind) || ((0x221U >> (parentKind & 0x1f) & 1) == 0))
        goto switchD_00342ec4_default;
        break;
      case 4:
        if (parentKind == ENUM) break;
        pEVar5 = this->errorReporter;
        pcVar4 = "Enumerants can only appear in enums.";
        sStackY_1e0 = 0x25;
        goto LAB_00342e98;
      case 6:
      case 7:
      case 8:
        if ((GROUP < parentKind) || ((0x1a0U >> (parentKind & 0x1f) & 1) == 0)) {
          message_05.content.size_ = 0x2d;
          message_05.content.ptr = "This declaration can only appear in structs.";
          ErrorReporter::addErrorOn<capnp::compiler::Declaration::Reader&>
                    (this->errorReporter,&decl,message_05);
        }
        Declaration::Reader::getName((Reader *)&_kjCondition,&decl);
        RVar7 = LocatedText::Reader::getValue((Reader *)&_kjCondition);
        if (RVar7.super_StringPtr.content.size_ == 1) {
          Declaration::Reader::getNestedDecls(&local_90,&decl);
          if (decl._reader.dataSize < 0x20) {
            WVar3 = FILE;
          }
          else {
            WVar3 = *(Which *)((long)decl._reader.data + 2);
          }
          nestedDecls_00.reader.capTable = local_90.reader.capTable;
          nestedDecls_00.reader.segment = local_90.reader.segment;
          nestedDecls_00.reader.ptr = local_90.reader.ptr;
          nestedDecls_00.reader.elementCount = local_90.reader.elementCount;
          nestedDecls_00.reader.step = local_90.reader.step;
          nestedDecls_00.reader.structDataSize = local_90.reader.structDataSize;
          nestedDecls_00.reader.structPointerCount = local_90.reader.structPointerCount;
          nestedDecls_00.reader.elementSize = local_90.reader.elementSize;
          nestedDecls_00.reader._39_1_ = local_90.reader._39_1_;
          nestedDecls_00.reader.nestingLimit = local_90.reader.nestingLimit;
          nestedDecls_00.reader._44_4_ = local_90.reader._44_4_;
          check(this,nestedDecls_00,WVar3);
        }
        else {
          _kjCondition.left = (unsigned_long)this->errorReporter;
          _kjCondition.op.content.ptr =
               (char *)((ulong)_kjCondition.op.content.ptr & 0xffffffff00000000);
          _kjCondition.op.content.size_ = 0;
          _kjCondition._32_8_ = &_kjCondition.op;
          Declaration::Reader::getNestedDecls(&local_c0,&decl);
          if (decl._reader.dataSize < 0x20) {
            WVar3 = FILE;
          }
          else {
            WVar3 = *(Which *)((long)decl._reader.data + 2);
          }
          nestedDecls_01.reader.capTable = local_c0.reader.capTable;
          nestedDecls_01.reader.segment = local_c0.reader.segment;
          nestedDecls_01.reader.ptr = local_c0.reader.ptr;
          nestedDecls_01.reader.elementCount = local_c0.reader.elementCount;
          nestedDecls_01.reader.step = local_c0.reader.step;
          nestedDecls_01.reader.structDataSize = local_c0.reader.structDataSize;
          nestedDecls_01.reader.structPointerCount = local_c0.reader.structPointerCount;
          nestedDecls_01.reader.elementSize = local_c0.reader.elementSize;
          nestedDecls_01.reader._39_1_ = local_c0.reader._39_1_;
          nestedDecls_01.reader.nestingLimit = local_c0.reader.nestingLimit;
          nestedDecls_01.reader._44_4_ = local_c0.reader._44_4_;
          check((DuplicateNameDetector *)&_kjCondition,nestedDecls_01,WVar3);
          std::
          _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>_>
          ::~_Rb_tree((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>_>
                       *)&_kjCondition.right);
        }
        break;
      case 10:
        if (parentKind != INTERFACE) {
          pEVar5 = this->errorReporter;
          pcVar4 = "Methods can only appear in interfaces.";
          sStackY_1e0 = 0x27;
          goto LAB_00342e98;
        }
        break;
      default:
        goto switchD_00342ec4_default;
      }
    }
    local_d0.index = local_d0.index + 1;
  } while( true );
}

Assistant:

void NodeTranslator::DuplicateNameDetector::check(
    List<Declaration>::Reader nestedDecls, Declaration::Which parentKind) {
  for (auto decl: nestedDecls) {
    {
      auto name = decl.getName();
      auto nameText = name.getValue();
      auto insertResult = names.insert(std::make_pair(nameText, name));
      if (!insertResult.second) {
        if (nameText.size() == 0 && decl.isUnion()) {
          errorReporter.addErrorOn(
              name, kj::str("An unnamed union is already defined in this scope."));
          errorReporter.addErrorOn(
              insertResult.first->second, kj::str("Previously defined here."));
        } else {
          errorReporter.addErrorOn(
              name, kj::str("'", nameText, "' is already defined in this scope."));
          errorReporter.addErrorOn(
              insertResult.first->second, kj::str("'", nameText, "' previously defined here."));
        }
      }

      switch (decl.which()) {
        case Declaration::USING: {
          kj::StringPtr targetName = getExpressionTargetName(decl.getUsing().getTarget());
          if (targetName.size() > 0 && targetName[0] >= 'a' && targetName[0] <= 'z') {
            // Target starts with lower-case letter, so alias should too.
            if (nameText.size() > 0 && (nameText[0] < 'a' || nameText[0] > 'z')) {
              errorReporter.addErrorOn(name,
                  "Non-type names must begin with a lower-case letter.");
            }
          } else {
            // Target starts with capital or is not named (probably, an import). Require
            // capitalization.
            if (nameText.size() > 0 && (nameText[0] < 'A' || nameText[0] > 'Z')) {
              errorReporter.addErrorOn(name,
                  "Type names must begin with a capital letter.");
            }
          }
          break;
        }

        case Declaration::ENUM:
        case Declaration::STRUCT:
        case Declaration::INTERFACE:
          if (nameText.size() > 0 && (nameText[0] < 'A' || nameText[0] > 'Z')) {
            errorReporter.addErrorOn(name,
                "Type names must begin with a capital letter.");
          }
          break;

        case Declaration::CONST:
        case Declaration::ANNOTATION:
        case Declaration::ENUMERANT:
        case Declaration::METHOD:
        case Declaration::FIELD:
        case Declaration::UNION:
        case Declaration::GROUP:
          if (nameText.size() > 0 && (nameText[0] < 'a' || nameText[0] > 'z')) {
            errorReporter.addErrorOn(name,
                "Non-type names must begin with a lower-case letter.");
          }
          break;

        default:
          KJ_ASSERT(nameText.size() == 0, "Don't know what naming rules to enforce for node type.",
                    (uint)decl.which());
          break;
      }

      if (nameText.findFirst('_') != kj::none) {
        errorReporter.addErrorOn(name,
            "Cap'n Proto declaration names should use camelCase and must not contain "
            "underscores. (Code generators may convert names to the appropriate style for the "
            "target language.)");
      }
    }

    switch (decl.which()) {
      case Declaration::USING:
      case Declaration::CONST:
      case Declaration::ENUM:
      case Declaration::STRUCT:
      case Declaration::INTERFACE:
      case Declaration::ANNOTATION:
        switch (parentKind) {
          case Declaration::FILE:
          case Declaration::STRUCT:
          case Declaration::INTERFACE:
            // OK.
            break;
          default:
            errorReporter.addErrorOn(decl, "This kind of declaration doesn't belong here.");
            break;
        }
        break;

      case Declaration::ENUMERANT:
        if (parentKind != Declaration::ENUM) {
          errorReporter.addErrorOn(decl, "Enumerants can only appear in enums.");
        }
        break;
      case Declaration::METHOD:
        if (parentKind != Declaration::INTERFACE) {
          errorReporter.addErrorOn(decl, "Methods can only appear in interfaces.");
        }
        break;
      case Declaration::FIELD:
      case Declaration::UNION:
      case Declaration::GROUP:
        switch (parentKind) {
          case Declaration::STRUCT:
          case Declaration::UNION:
          case Declaration::GROUP:
            // OK.
            break;
          default:
            errorReporter.addErrorOn(decl, "This declaration can only appear in structs.");
            break;
        }

        // Struct members may have nested decls.  We need to check those here, because no one else
        // is going to do it.
        if (decl.getName().getValue().size() == 0) {
          // Unnamed union.  Check members as if they are in the same scope.
          check(decl.getNestedDecls(), decl.which());
        } else {
          // Children are in their own scope.
          DuplicateNameDetector(errorReporter)
              .check(decl.getNestedDecls(), decl.which());
        }

        break;

      default:
        errorReporter.addErrorOn(decl, "This kind of declaration doesn't belong here.");
        break;
    }
  }
}